

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weibull_dist.hpp
# Opt level: O3

result_type_conflict1 __thiscall
trng::weibull_dist<float>::operator()(weibull_dist<float> *this,lcg64_shift *r)

{
  float fVar1;
  ulong uVar2;
  float fVar3;
  
  fVar1 = (this->P).theta_;
  uVar2 = (r->S).r * (r->P).a + (r->P).b;
  (r->S).r = uVar2;
  uVar2 = uVar2 >> 0x11 ^ uVar2;
  uVar2 = uVar2 << 0x1f ^ uVar2;
  fVar3 = logf((float)(uVar2 >> 1 ^ uVar2 >> 9) * -1.08420204e-19 + 1.0);
  fVar3 = powf(-fVar3,1.0 / (this->P).beta_);
  return fVar3 * fVar1;
}

Assistant:

TRNG_CUDA_ENABLE result_type operator()(R &r) {
      return P.theta() * math::pow(-math::ln(utility::uniformoc<result_type>(r)), 1 / P.beta());
    }